

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

void __thiscall
rudp::session::send_packets_internal(session *this,buffers_ptr_t *data,send_cb_t *cb)

{
  implementation_type *impl;
  socket_type sVar1;
  socket *psVar2;
  element_type *peVar3;
  stored_size_type sVar4;
  service_type *psVar5;
  error_category *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined3 uVar11;
  reference psVar12;
  reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:523:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  ptr local_98;
  stored_size_type local_80;
  undefined1 local_78 [24];
  __shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  function<void_(bool)> local_50;
  
  psVar2 = this->socket;
  psVar12 = boost::container::
            vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
            ::back(&((data->
                     super___shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->
                    super_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
                  );
  peVar3 = (psVar12->
           super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  psVar12 = boost::container::
            vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
            ::back(&((data->
                     super___shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->
                    super_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
                  );
  sVar4 = (((psVar12->
            super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->
          super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ).m_holder.m_size;
  local_78._0_8_ = this;
  std::__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rudp::session,void>
            ((__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
             (__weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::
  __shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_60,
                 &data->
                  super___shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::function<void_(bool)>::function(&local_50,cb);
  psVar5 = (psVar2->
           super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           ).impl_.service_;
  local_98.h = (anon_class_72_4_ff401564 *)local_78;
  local_80 = sVar4;
  op = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:523:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::asio_handler_allocate(0xe8);
  impl = &(psVar2->
          super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ).impl_.implementation_;
  local_98.p = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:523:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  sVar1 = (impl->super_base_implementation_type).socket_;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.super_operation.func_ =
       boost::asio::detail::
       reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:523:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.super_operation.task_result_ = 0;
  bVar10 = (psVar5->super_reactive_socket_service_base).success_ec_.failed_;
  uVar11 = *(undefined3 *)&(psVar5->super_reactive_socket_service_base).success_ec_.field_0x5;
  peVar6 = (psVar5->super_reactive_socket_service_base).success_ec_.cat_;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.ec_.val_ = (psVar5->super_reactive_socket_service_base).success_ec_.val_;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.ec_.failed_ = bVar10;
  *(undefined3 *)
   &(op->
    super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
    ).super_reactor_op.ec_.field_0x5 = uVar11;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.ec_.cat_ = peVar6;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.bytes_transferred_ = 0;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.perform_func_ =
       boost::asio::detail::
       reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
       ::do_perform;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).socket_ = sVar1;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.data_ = peVar3;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.size_ = local_80;
  uVar7 = *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 8);
  uVar8 = *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0xc);
  uVar9 = *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0x14);
  *(undefined8 *)
   &(op->
    super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
    ).destination_.impl_.data_ = *(undefined8 *)&(this->endpoint).impl_.data_;
  *(undefined8 *)
   ((long)&(op->
           super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
           ).destination_.impl_.data_ + 8) = uVar7;
  *(undefined8 *)
   ((long)&(op->
           super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
           ).destination_.impl_.data_ + 0xc) = uVar8;
  *(undefined8 *)
   ((long)&(op->
           super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
           ).destination_.impl_.data_ + 0x14) = uVar9;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).flags_ = 0;
  local_98.v = op;
  send_packets_internal(std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&,std::function<void(bool)>const&)
  ::$_0::__0((__0 *)&op->handler_,(anon_class_72_4_ff401564 *)local_78);
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(psVar2->
                        super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        ).impl_.executor_);
  local_98.p = op;
  boost::asio::detail::reactive_socket_service_base::start_op
            (&psVar5->super_reactive_socket_service_base,&impl->super_base_implementation_type,1,
             (reactor_op *)op,false,true,false);
  local_98.v = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:523:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_98.p = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:523:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  boost::asio::detail::
  reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:523:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr(&local_98);
  send_packets_internal(std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&,std::function<void(bool)>const&)
  ::$_0::~__0((__0 *)local_78);
  return;
}

Assistant:

void session::send_packets_internal(
    const buffers_ptr_t &data,
    const send_cb_t &cb
  ) {
    socket.async_send_to( boost::asio::buffer( data->back()->data(), data->back()->size() ),
      endpoint,
      [this,this_=shared_from_this(),data,cb]( const boost::system::error_code &error, size_t ) {
        if( !error ) {
	         data->pop_back();
	         if( data->empty() );
	         else send_packets_internal( data, cb );
	       }
	       else {
          cb( false );
        }
      }
    );
  }